

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.h
# Opt level: O0

void __thiscall HEkkDual::~HEkkDual(HEkkDual *this)

{
  HEkkDualRow *this_00;
  long in_RDI;
  MChoice *in_stack_ffffffffffffff80;
  long local_78;
  vector<HEkkDualRow,_std::allocator<HEkkDualRow>_> *in_stack_ffffffffffffff90;
  long local_60;
  long local_48;
  long local_30;
  long local_10;
  
  local_10 = in_RDI + 0x2ad8;
  do {
    local_10 = local_10 + -0x78;
    MFinish::~MFinish((MFinish *)0x779585);
  } while (local_10 != in_RDI + 0x2718);
  local_30 = in_RDI + 0x2718;
  do {
    local_30 = local_30 + -0x248;
    MChoice::~MChoice(in_stack_ffffffffffffff80);
  } while (local_30 != in_RDI + 0x14d8);
  std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::~vector(in_stack_ffffffffffffff90);
  local_48 = in_RDI + 0x14a8;
  do {
    local_48 = local_48 + -0xb0;
    HVectorBase<double>::~HVectorBase((HVectorBase<double> *)in_stack_ffffffffffffff80);
  } while (local_48 != in_RDI + 0xf28);
  local_60 = in_RDI + 0xf28;
  do {
    local_60 = local_60 + -0x70;
    HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)in_stack_ffffffffffffff80);
  } while (local_60 != in_RDI + 0xba8);
  this_00 = (HEkkDualRow *)(in_RDI + 0x828);
  local_78 = in_RDI + 0xba8;
  do {
    local_78 = local_78 + -0x70;
    HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)this_00);
  } while ((HEkkDualRow *)local_78 != this_00);
  HEkkDualRHS::~HEkkDualRHS((HEkkDualRHS *)this_00);
  HEkkDualRow::~HEkkDualRow(this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  HVectorBase<double>::~HVectorBase((HVectorBase<double> *)this_00);
  return;
}

Assistant:

HEkkDual(HEkk& simplex)
      : ekk_instance_(simplex), dualRow(simplex), dualRHS(simplex) {
    initialiseInstance();
    dualRow.setup();
    dualRHS.setup();
    if (!(ekk_instance_.info_.simplex_strategy == kSimplexStrategyDualPlain))
      initialiseInstanceParallel(simplex);
  }